

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldDefault_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  CppType CVar5;
  Type TVar6;
  EnumValueDescriptor *pEVar7;
  LogMessage *pLVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  size_t i;
  ulong uVar12;
  char *pcVar13;
  _anonymous_namespace_ *this_00;
  char cVar14;
  string *this_01;
  long lStack_a0;
  LogFinisher local_91;
  string out;
  string result;
  
  if (*(int *)(this + 0x3c) == 3) {
    pcVar13 = "[]";
    goto LAB_00288fd3;
  }
  this_00 = this;
  CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar5) {
  case CPPTYPE_INT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)&result,*(int *)(this + 0x90));
    StrCat_abi_cxx11_(&out,(protobuf *)&result,a);
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&out);
    break;
  case CPPTYPE_INT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&result,*(long *)(this + 0x90));
    StrCat_abi_cxx11_(&out,(protobuf *)&result,a_03);
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&out);
    break;
  case CPPTYPE_UINT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)&result,*(int *)(this + 0x90));
    StrCat_abi_cxx11_(&out,(protobuf *)&result,a_00);
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&out);
    break;
  case CPPTYPE_UINT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&result,*(long *)(this + 0x90));
    StrCat_abi_cxx11_(&out,(protobuf *)&result,a_01);
    anon_unknown_0::MaybeNumberString(__return_storage_ptr__,(FieldDescriptor *)this,&out);
    break;
  case CPPTYPE_DOUBLE:
    SimpleDtoa_abi_cxx11_(&result,(protobuf *)this_00,*(double *)(this + 0x90));
    std::__cxx11::string::string((string *)&out,(string *)&result);
    anon_unknown_0::PostProcessFloat(__return_storage_ptr__,&out);
    goto LAB_00289180;
  case CPPTYPE_FLOAT:
    SimpleFtoa_abi_cxx11_(&result,(protobuf *)this_00,*(float *)(this + 0x90));
    std::__cxx11::string::string((string *)&out,(string *)&result);
    anon_unknown_0::PostProcessFloat(__return_storage_ptr__,&out);
LAB_00289180:
    std::__cxx11::string::~string((string *)&out);
    this_01 = &result;
    goto LAB_002895bc;
  case CPPTYPE_BOOL:
    pcVar13 = "false";
    if (this[0x90] != (_anonymous_namespace_)0x0) {
      pcVar13 = "true";
    }
    goto LAB_00288fd3;
  case CPPTYPE_ENUM:
    pEVar7 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    strings::AlphaNum::AlphaNum((AlphaNum *)&result,*(int *)(pEVar7 + 0x10));
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&result,a_02);
    return __return_storage_ptr__;
  case CPPTYPE_STRING:
    TVar6 = FieldDescriptor::type((FieldDescriptor *)this);
    out._M_dataplus._M_p = (pointer)&out.field_2;
    if (TVar6 == TYPE_STRING) {
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      plVar2 = *(long **)(this + 0x90);
      uVar12 = 0;
      while( true ) {
        uVar3 = plVar2[1];
        if (uVar3 <= uVar12) break;
        lVar4 = *plVar2;
        if (uVar12 + 1 < uVar3) {
          uVar10 = *(byte *)(lVar4 + uVar12 + 1) & 0x3f;
        }
        else {
          uVar10 = 0;
        }
        if (uVar12 + 2 < uVar3) {
          uVar9 = *(byte *)(lVar4 + uVar12 + 2) & 0x3f;
        }
        else {
          uVar9 = 0;
        }
        bVar1 = *(byte *)(lVar4 + uVar12);
        uVar11 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          if ((bVar1 & 0xe0) == 0xc0) {
            if (uVar3 - uVar12 == 1) {
LAB_00289522:
              internal::LogMessage::LogMessage
                        ((LogMessage *)&result,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,0x356);
              pLVar8 = internal::LogMessage::operator<<
                                 ((LogMessage *)&result,"The default value for field ");
              pLVar8 = internal::LogMessage::operator<<(pLVar8,*(string **)(this + 8));
              pLVar8 = internal::LogMessage::operator<<
                                 (pLVar8,
                                  " was truncated since it contained invalid UTF-8 or codepoints outside the basic multilingual plane."
                                 );
              internal::LogFinisher::operator=(&local_91,pLVar8);
              internal::LogMessage::~LogMessage((LogMessage *)&result);
              break;
            }
            uVar11 = uVar10 | (bVar1 & 0x1f) << 6;
            lStack_a0 = 2;
          }
          else {
            if ((uVar3 - uVar12 < 3) || ((bVar1 & 0xf0) != 0xe0)) goto LAB_00289522;
            uVar11 = uVar9 | uVar10 << 6 | (uint)bVar1 << 0xc;
            lStack_a0 = 3;
          }
        }
        else {
          lStack_a0 = 1;
        }
        uVar10 = uVar11 & 0xffff;
        switch(uVar10) {
        case 8:
          break;
        case 9:
          break;
        case 10:
          break;
        case 0xb:
switchD_0028933e_caseD_b:
          if ((ushort)((ushort)uVar11 - 0x20) < 0x5f) {
            std::__cxx11::string::push_back((char)&out);
          }
          else {
            if ((ushort)uVar11 < 0x100) {
              StringPrintf_abi_cxx11_(&result,"\\x%02x");
              std::__cxx11::string::append((string *)&out);
            }
            else {
              StringPrintf_abi_cxx11_(&result,"\\u%04x");
              std::__cxx11::string::append((string *)&out);
            }
            std::__cxx11::string::~string((string *)&result);
          }
          goto LAB_002893b8;
        case 0xc:
          break;
        case 0xd:
          break;
        default:
          if ((((uVar10 != 0x5c) && (uVar10 != 0x26)) && (uVar10 != 0x27)) &&
             (((uVar10 != 0x3c && (uVar10 != 0x3d)) && ((uVar10 != 0x3e && (uVar10 != 0x22))))))
          goto switchD_0028933e_caseD_b;
        }
        std::__cxx11::string::append((char *)&out);
LAB_002893b8:
        uVar12 = uVar12 + lStack_a0;
      }
      std::operator+(&result,"\"",&out);
      std::operator+(__return_storage_ptr__,&result,"\"");
    }
    else {
      lVar4 = *(long *)(this + 0x90);
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      for (uVar12 = 0; uVar12 < *(ulong *)(lVar4 + 8); uVar12 = uVar12 + 3) {
        cVar14 = (char)&out;
        std::__cxx11::string::push_back(cVar14);
        std::__cxx11::string::push_back(cVar14);
        std::__cxx11::string::push_back(cVar14);
        std::__cxx11::string::push_back(cVar14);
      }
      std::operator+(&result,"\"",&out);
      std::operator+(__return_storage_ptr__,&result,"\"");
    }
    std::__cxx11::string::~string((string *)&result);
    break;
  case CPPTYPE_MESSAGE:
    pcVar13 = "null";
    goto LAB_00288fd3;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&result,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x361);
    pLVar8 = internal::LogMessage::operator<<((LogMessage *)&result,"Shouldn\'t reach here.");
    internal::LogFinisher::operator=((LogFinisher *)&out,pLVar8);
    internal::LogMessage::~LogMessage((LogMessage *)&result);
    pcVar13 = "";
LAB_00288fd3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar13,(allocator *)&result);
    return __return_storage_ptr__;
  }
  this_01 = &out;
LAB_002895bc:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string JSFieldDefault(const FieldDescriptor* field) {
  if (field->is_repeated()) {
    return "[]";
  }

  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int32()));
    case FieldDescriptor::CPPTYPE_UINT32:
      // The original codegen is in Java, and Java protobufs store unsigned
      // integer values as signed integer values. In order to exactly match the
      // output, we need to reinterpret as base-2 signed. Ugh.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int32>(field->default_value_uint32())));
    case FieldDescriptor::CPPTYPE_INT64:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int64()));
    case FieldDescriptor::CPPTYPE_UINT64:
      // See above note for uint32 -- reinterpreting as signed.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int64>(field->default_value_uint64())));
    case FieldDescriptor::CPPTYPE_ENUM:
      return StrCat(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return FloatToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return DoubleToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        std::string out;
        bool is_valid = EscapeJSString(field->default_value_string(), &out);
        if (!is_valid) {
          // TODO(b/115551870): Decide whether this should be a hard error.
          GOOGLE_LOG(WARNING) << "The default value for field " << field->full_name()
                       << " was truncated since it contained invalid UTF-8 or"
                          " codepoints outside the basic multilingual plane.";
        }
        return "\"" + out + "\"";
      } else {  // Bytes
        return "\"" + EscapeBase64(field->default_value_string()) + "\"";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";
  }
  GOOGLE_LOG(FATAL) << "Shouldn't reach here.";
  return "";
}